

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O0

void formatPositions<QGraphicsSceneWheelEvent>(QDebug *debug,QGraphicsSceneWheelEvent *event)

{
  QDebug *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QPointF *in_stack_ffffffffffffffb8;
  QPoint *point;
  char *t;
  
  t = *(char **)(in_FS_OFFSET + 0x28);
  QDebug::operator<<((QDebug *)in_RDI,t);
  QGraphicsSceneWheelEvent::pos((QGraphicsSceneWheelEvent *)in_stack_ffffffffffffffb8);
  QtDebugUtils::formatQPoint<QPointF>(in_RSI,in_stack_ffffffffffffffb8);
  QDebug::operator<<((QDebug *)in_RDI,t);
  point = in_RDI;
  QGraphicsSceneWheelEvent::scenePos((QGraphicsSceneWheelEvent *)in_stack_ffffffffffffffb8);
  QtDebugUtils::formatQPoint<QPointF>(in_RSI,in_stack_ffffffffffffffb8);
  QDebug::operator<<((QDebug *)point,t);
  QGraphicsSceneWheelEvent::screenPos((QGraphicsSceneWheelEvent *)in_RDI);
  QtDebugUtils::formatQPoint<QPoint>(in_RSI,point);
  if (*(char **)(in_FS_OFFSET + 0x28) == t) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void formatPositions(QDebug &debug, const Event *event)
{
    debug << ", pos=";
    QtDebugUtils::formatQPoint(debug, event->pos());
    debug << ", scenePos=";
    QtDebugUtils::formatQPoint(debug, event->scenePos());
    debug << ", screenPos=";
    QtDebugUtils::formatQPoint(debug, event->screenPos());
}